

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlCheckEncoding(htmlParserCtxtPtr ctxt,xmlChar *attvalue)

{
  byte *local_20;
  xmlChar *encoding;
  xmlChar *attvalue_local;
  htmlParserCtxtPtr ctxt_local;
  
  if (attvalue != (xmlChar *)0x0) {
    local_20 = xmlStrcasestr(attvalue,"charset");
    if (local_20 != (byte *)0x0) {
      local_20 = local_20 + 7;
    }
    if ((local_20 != (byte *)0x0) &&
       ((*local_20 == 0x20 || (((8 < *local_20 && (*local_20 < 0xb)) || (*local_20 == 0xd)))))) {
      local_20 = xmlStrcasestr(attvalue,"=");
    }
    if ((local_20 != (byte *)0x0) && (*local_20 == 0x3d)) {
      htmlCheckEncodingDirect(ctxt,local_20 + 1);
    }
  }
  return;
}

Assistant:

static void
htmlCheckEncoding(htmlParserCtxtPtr ctxt, const xmlChar *attvalue) {
    const xmlChar *encoding;

    if (!attvalue)
	return;

    encoding = xmlStrcasestr(attvalue, BAD_CAST"charset");
    if (encoding != NULL) {
	encoding += 7;
    }
    /*
     * skip blank
     */
    if (encoding && IS_BLANK_CH(*encoding))
	encoding = xmlStrcasestr(attvalue, BAD_CAST"=");
    if (encoding && *encoding == '=') {
	encoding ++;
	htmlCheckEncodingDirect(ctxt, encoding);
    }
}